

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btOverlappingPairCache.cpp
# Opt level: O3

void __thiscall
btHashedOverlappingPairCache::processAllOverlappingPairs
          (btHashedOverlappingPairCache *this,btOverlapCallback *callback,btDispatcher *dispatcher)

{
  int iVar1;
  int iVar2;
  btBroadphasePair *pbVar3;
  
  if (0 < (this->m_overlappingPairArray).m_size) {
    iVar2 = 0;
    do {
      pbVar3 = (this->m_overlappingPairArray).m_data + iVar2;
      iVar1 = (*callback->_vptr_btOverlapCallback[2])(callback,pbVar3);
      if ((char)iVar1 == '\0') {
        iVar2 = iVar2 + 1;
      }
      else {
        (*(this->super_btOverlappingPairCache).super_btOverlappingPairCallback.
          _vptr_btOverlappingPairCallback[3])(this,pbVar3->m_pProxy0,pbVar3->m_pProxy1,dispatcher);
        gOverlappingPairs = gOverlappingPairs + -1;
      }
    } while (iVar2 < (this->m_overlappingPairArray).m_size);
  }
  return;
}

Assistant:

void	btHashedOverlappingPairCache::processAllOverlappingPairs(btOverlapCallback* callback,btDispatcher* dispatcher)
{

	int i;

//	printf("m_overlappingPairArray.size()=%d\n",m_overlappingPairArray.size());
	for (i=0;i<m_overlappingPairArray.size();)
	{
	
		btBroadphasePair* pair = &m_overlappingPairArray[i];
		if (callback->processOverlap(*pair))
		{
			removeOverlappingPair(pair->m_pProxy0,pair->m_pProxy1,dispatcher);

			gOverlappingPairs--;
		} else
		{
			i++;
		}
	}
}